

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm.h
# Opt level: O0

void ncnn::conv_im2col_sgemm_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *_bias,int kernel_w,int kernel_h,
               int stride_w,int stride_h,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  float *pfVar11;
  Mat *in_RCX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  float sum0;
  __m128 _k0;
  __m128 _p0;
  __m128 _sum0_4;
  int k_3;
  float *va_3;
  float *vb_3;
  __m128 _vb0_3;
  __m128 _va0_4;
  __m128 _vb3_1;
  __m128 _vb2_1;
  __m128 _vb1_1;
  __m128 _vb0_2;
  __m128 _va3_3;
  __m128 _va2_3;
  __m128 _va1_3;
  __m128 _va0_3;
  int k_2;
  __m128 _sum0_2;
  float *va_2;
  float *vb_2;
  int j_2;
  float bias0;
  float *output;
  int i_4;
  __m128 _va;
  __m128 _vb0_1;
  __m128 _va3_2;
  __m128 _va2_2;
  __m128 _va1_2;
  __m128 _va0_2;
  __m128 _vb3;
  __m128 _vb2;
  __m128 _vb1;
  __m128 _vb0;
  int k_1;
  __m128 _sum3_1;
  __m128 _sum2_1;
  __m128 _sum1_1;
  __m128 _sum0_1;
  __m128 _sum0_3;
  float *va_1;
  float *vb_1;
  __m128 _va3_1;
  __m128 _va2_1;
  __m128 _va1_1;
  __m128 _va0_1;
  __m128 _vb_1;
  __m128 _va3;
  __m128 _va2;
  __m128 _va1;
  __m128 _va0;
  __m128 _vb;
  int k;
  __m128 _sum3;
  __m128 _sum2;
  __m128 _sum1;
  __m128 _sum0;
  float *va;
  float *vb;
  int j_1;
  float *biasptr;
  float zeros [4];
  float *output3;
  float *output2;
  float *output1;
  float *output0;
  int i_3;
  int pp;
  int remain_outch_start;
  int nn_outch;
  int L;
  int N;
  int q_1;
  float *tmpptr_1;
  float *img0_1;
  int i_2;
  int q;
  float *tmpptr;
  float *img0;
  int i_1;
  int ii;
  int remain_size_start;
  int nn_size;
  Mat bottom_tm;
  int out_size;
  int kernel_size;
  int index;
  int col;
  int row;
  int j;
  int i;
  int v;
  int u;
  int retID;
  float *input;
  int p;
  float *ret;
  int stride;
  Mat bottom_im2col;
  float *bias;
  int outch;
  int outh;
  int outw;
  size_t elemsize;
  int inch;
  int w;
  undefined4 in_stack_ffffffffffffdd58;
  undefined4 in_stack_ffffffffffffdd5c;
  undefined4 in_stack_ffffffffffffdd60;
  float in_stack_ffffffffffffdd64;
  Mat *in_stack_ffffffffffffdd68;
  Mat *in_stack_ffffffffffffdd70;
  float local_2084;
  float *local_18a8;
  float local_182c;
  undefined8 local_1808;
  undefined8 uStack_1800;
  int local_17ec;
  Mat local_17e8;
  float *local_17a8;
  Mat local_17a0;
  float *local_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  int local_16ac;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  Mat local_1690;
  float *local_1650;
  Mat local_1648;
  float *local_1608;
  int local_1600;
  float local_15fc;
  Mat local_15f8;
  float *local_15b8;
  int local_15ac;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  undefined8 local_1568;
  undefined8 uStack_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 local_1538;
  undefined8 uStack_1530;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  int local_14fc;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  Mat local_14a8;
  float *local_1468;
  Mat local_1460;
  float *local_1420;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  undefined8 uStack_13c0;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  int local_136c;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined8 local_1358;
  undefined8 uStack_1350;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  undefined8 uStack_1330;
  Mat local_1328;
  float *local_12e8;
  Mat local_12e0;
  float *local_12a0;
  int local_1294;
  float *local_1290;
  float local_1288 [6];
  Mat local_1270;
  float *local_1230;
  Mat local_1228;
  float *local_11e8;
  Mat local_11e0;
  float *local_11a0;
  Mat local_1198;
  float *local_1158;
  int local_114c;
  int local_1148;
  int local_1144;
  int local_1140;
  int local_113c;
  int local_1138;
  int local_1134;
  Mat local_1130;
  float *local_10f0;
  Mat local_10e8;
  float *local_10a8;
  int local_10a0;
  int local_109c;
  Mat local_1098;
  float *local_1058;
  Mat local_1050;
  float *local_1010;
  int local_1008;
  int local_1004;
  int local_1000;
  int local_ffc;
  int local_fb8;
  int local_fb4;
  int local_fb0;
  int local_fac;
  int local_fa8;
  int local_fa4;
  int local_fa0;
  int local_f9c;
  int local_f98;
  int local_f94;
  Mat local_f90;
  float *local_f50;
  int local_f48;
  float *local_f38;
  int local_f2c;
  Mat local_f28;
  float *local_ee8;
  int local_edc;
  int local_ed8;
  int local_ed4;
  undefined8 local_ed0;
  int local_ec8;
  int local_ec4;
  int local_ec0;
  int local_ebc;
  undefined8 local_e98;
  undefined8 uStack_e90;
  float *local_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  float *local_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  float *local_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  float *local_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  float *local_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  float *local_de8;
  float *local_de0;
  float *local_dd8;
  float *local_dd0;
  float *local_dc8;
  float *local_dc0;
  float *local_db8;
  float *local_db0;
  float *local_da8;
  float *local_da0;
  float *local_d98;
  float *local_d90;
  float *local_d88;
  float *local_d80;
  float *local_d78;
  float *local_d70;
  float *local_d68;
  float *local_d60;
  float *local_d58;
  float *local_d50;
  undefined4 local_d48;
  undefined4 uStack_d44;
  undefined4 uStack_d40;
  undefined4 uStack_d3c;
  undefined4 local_d38;
  float local_d28;
  float fStack_d24;
  float fStack_d20;
  float fStack_d1c;
  float local_d18;
  float local_d08;
  float fStack_d04;
  float fStack_d00;
  float fStack_cfc;
  float local_cf8;
  float local_ce8;
  float fStack_ce4;
  float fStack_ce0;
  float fStack_cdc;
  float local_cd8;
  float local_cc8;
  float fStack_cc4;
  float fStack_cc0;
  float fStack_cbc;
  float local_cb8;
  float local_ca8;
  float fStack_ca4;
  float fStack_ca0;
  float fStack_c9c;
  float local_c98;
  float local_c88;
  float fStack_c84;
  float fStack_c80;
  float fStack_c7c;
  float local_c78;
  float local_c68;
  float fStack_c64;
  float fStack_c60;
  float fStack_c5c;
  float local_c58;
  float local_c48;
  float fStack_c44;
  float fStack_c40;
  float fStack_c3c;
  float local_c38;
  float local_c28;
  float fStack_c24;
  float fStack_c20;
  float fStack_c1c;
  float local_c18;
  float local_c08;
  float fStack_c04;
  float fStack_c00;
  float fStack_bfc;
  float local_bf8;
  float local_be8;
  float fStack_be4;
  float fStack_be0;
  float fStack_bdc;
  float local_bd8;
  undefined4 local_bc8;
  undefined4 uStack_bc4;
  undefined4 uStack_bc0;
  undefined4 uStack_bbc;
  undefined4 local_bb8;
  undefined4 local_ba8;
  undefined4 uStack_ba4;
  undefined4 uStack_ba0;
  undefined4 uStack_b9c;
  undefined4 local_b98;
  undefined4 local_b88;
  undefined4 uStack_b84;
  undefined4 uStack_b80;
  undefined4 uStack_b7c;
  undefined4 local_b78;
  undefined4 local_b68;
  undefined4 uStack_b64;
  undefined4 uStack_b60;
  undefined4 uStack_b5c;
  undefined4 local_b58;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  float local_b38;
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  float local_b18;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  float local_af8;
  float local_ae8;
  float fStack_ae4;
  float fStack_ae0;
  float fStack_adc;
  float local_ad8;
  float local_ac8;
  float fStack_ac4;
  float fStack_ac0;
  float fStack_abc;
  float local_ab8;
  float local_aa8;
  float fStack_aa4;
  float fStack_aa0;
  float fStack_a9c;
  float local_a98;
  float local_a88;
  float fStack_a84;
  float fStack_a80;
  float fStack_a7c;
  float local_a78;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  float local_a58;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  float local_a38;
  float local_a28;
  float fStack_a24;
  float fStack_a20;
  float fStack_a1c;
  float local_a18;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  float local_9f8;
  float local_9e8;
  float fStack_9e4;
  float fStack_9e0;
  float fStack_9dc;
  float local_9d8;
  float local_9c8;
  float fStack_9c4;
  float fStack_9c0;
  float fStack_9bc;
  float local_9b8;
  float local_9a8;
  float fStack_9a4;
  float fStack_9a0;
  float fStack_99c;
  float local_998;
  float local_988;
  float fStack_984;
  float fStack_980;
  float fStack_97c;
  float local_978;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  float local_958;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float local_898;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  undefined8 local_848;
  undefined8 uStack_840;
  Mat *local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_ec4 = *(int *)(in_RDI + 0x2c);
  local_ec8 = *(int *)(in_RDI + 0x34);
  local_ed0 = *(undefined8 *)(in_RDI + 0x10);
  local_ed4 = *(int *)(in_RSI + 0x2c);
  local_ed8 = *(int *)(in_RSI + 0x30);
  local_edc = *(int *)(in_RSI + 0x34);
  local_ec0 = in_R9D;
  local_ebc = in_R8D;
  local_ee8 = Mat::operator_cast_to_float_(in_RCX);
  Mat::Mat(in_stack_ffffffffffffdd70,(int)((ulong)in_stack_ffffffffffffdd68 >> 0x20),
           (int)in_stack_ffffffffffffdd68,
           CONCAT44(in_stack_ffffffffffffdd64,in_stack_ffffffffffffdd60),
           (Allocator *)CONCAT44(in_stack_ffffffffffffdd5c,in_stack_ffffffffffffdd58));
  local_f2c = local_ec0 * local_ebc * local_ed4 * local_ed8;
  local_f38 = Mat::operator_cast_to_float_(&local_f28);
  for (local_f48 = 0; local_f48 < local_ec8; local_f48 = local_f48 + 1) {
    Mat::channel(in_stack_ffffffffffffdd68,(int)in_stack_ffffffffffffdd64);
    pfVar11 = Mat::operator_cast_to_float_(&local_f90);
    Mat::~Mat((Mat *)0x139fa9);
    local_f94 = local_f2c * local_f48;
    for (local_f98 = 0; local_f98 < local_ec0; local_f98 = local_f98 + 1) {
      for (local_f9c = 0; local_f9c < local_ebc; local_f9c = local_f9c + 1) {
        for (local_fa0 = 0; local_fa0 < local_ed8; local_fa0 = local_fa0 + 1) {
          for (local_fa4 = 0; local_fa4 < local_ed4; local_fa4 = local_fa4 + 1) {
            local_fa8 = local_f98 + local_fa0 * in_stack_00000010;
            local_fac = local_f9c + local_fa4 * in_stack_00000008;
            local_fb0 = local_fa8 * local_ec4 + local_fac;
            local_f38[local_f94] = pfVar11[local_fb0];
            local_f94 = local_f94 + 1;
          }
        }
      }
    }
    local_f50 = pfVar11;
  }
  local_fb4 = local_ebc * local_ec0;
  local_fb8 = local_ed4 * local_ed8;
  Mat::Mat(in_stack_ffffffffffffdd70,(int)((ulong)in_stack_ffffffffffffdd68 >> 0x20),
           (int)in_stack_ffffffffffffdd68,(int)in_stack_ffffffffffffdd64,
           CONCAT44(in_stack_ffffffffffffdd5c,in_stack_ffffffffffffdd58),(Allocator *)0x13a217);
  local_ffc = local_fb8 >> 2;
  local_1000 = local_ffc << 2;
  for (local_1004 = 0; local_1004 < local_ffc; local_1004 = local_1004 + 1) {
    local_1008 = local_1004 << 2;
    Mat::channel(in_stack_ffffffffffffdd68,(int)in_stack_ffffffffffffdd64);
    pfVar11 = Mat::operator_cast_to_float_(&local_1050);
    Mat::~Mat((Mat *)0x13a2a8);
    local_1010 = pfVar11 + local_1008;
    Mat::channel(in_stack_ffffffffffffdd68,(int)in_stack_ffffffffffffdd64);
    pfVar11 = Mat::operator_cast_to_float_(&local_1098);
    Mat::~Mat((Mat *)0x13a323);
    local_1058 = pfVar11;
    for (local_109c = 0; local_109c < local_ec8 * local_fb4; local_109c = local_109c + 1) {
      local_d50 = local_1010;
      local_df8 = *(undefined8 *)local_1010;
      uStack_df0 = *(undefined8 *)(local_1010 + 2);
      local_de8 = local_1058;
      *(undefined8 *)local_1058 = local_df8;
      *(undefined8 *)(local_1058 + 2) = uStack_df0;
      local_1058 = local_1058 + 4;
      local_1010 = local_1010 + local_fb8;
    }
  }
  for (local_10a0 = local_1000; local_10a0 < local_fb8; local_10a0 = local_10a0 + 1) {
    Mat::channel(in_stack_ffffffffffffdd68,(int)in_stack_ffffffffffffdd64);
    pfVar11 = Mat::operator_cast_to_float_(&local_10e8);
    Mat::~Mat((Mat *)0x13a4e9);
    local_10a8 = pfVar11 + local_10a0;
    Mat::channel(in_stack_ffffffffffffdd68,(int)in_stack_ffffffffffffdd64);
    pfVar11 = Mat::operator_cast_to_float_(&local_1130);
    Mat::~Mat((Mat *)0x13a56f);
    local_10f0 = pfVar11;
    for (local_1134 = 0; local_1134 < local_ec8 * local_fb4; local_1134 = local_1134 + 1) {
      *local_10f0 = *local_10a8;
      local_10f0 = local_10f0 + 1;
      local_10a8 = local_10a8 + local_fb8;
    }
  }
  local_1138 = local_ed4 * local_ed8;
  local_113c = local_ebc * local_ec0 * local_ec8;
  local_1140 = local_edc >> 2;
  local_1144 = local_1140 << 2;
  for (local_1148 = 0; local_1148 < local_1140; local_1148 = local_1148 + 1) {
    local_114c = local_1148 << 2;
    Mat::channel(in_stack_ffffffffffffdd68,(int)in_stack_ffffffffffffdd64);
    pfVar11 = Mat::operator_cast_to_float_(&local_1198);
    Mat::~Mat((Mat *)0x13a74a);
    local_1158 = pfVar11;
    Mat::channel(in_stack_ffffffffffffdd68,(int)in_stack_ffffffffffffdd64);
    pfVar11 = Mat::operator_cast_to_float_(&local_11e0);
    Mat::~Mat((Mat *)0x13a79e);
    local_11a0 = pfVar11;
    Mat::channel(in_stack_ffffffffffffdd68,(int)in_stack_ffffffffffffdd64);
    pfVar11 = Mat::operator_cast_to_float_(&local_1228);
    Mat::~Mat((Mat *)0x13a7f3);
    local_11e8 = pfVar11;
    Mat::channel(in_stack_ffffffffffffdd68,(int)in_stack_ffffffffffffdd64);
    pfVar11 = Mat::operator_cast_to_float_(&local_1270);
    Mat::~Mat((Mat *)0x13a848);
    local_1230 = pfVar11;
    memset(local_1288,0,0x10);
    if (local_ee8 == (float *)0x0) {
      local_18a8 = local_1288;
    }
    else {
      local_18a8 = local_ee8 + local_114c;
    }
    local_1290 = local_18a8;
    for (local_1294 = 0; local_1294 + 3 < local_1138; local_1294 = local_1294 + 4) {
      Mat::channel(in_stack_ffffffffffffdd68,(int)in_stack_ffffffffffffdd64);
      pfVar11 = Mat::operator_cast_to_float_(&local_12e0);
      Mat::~Mat((Mat *)0x13a929);
      local_12a0 = pfVar11;
      Mat::channel(in_stack_ffffffffffffdd68,(int)in_stack_ffffffffffffdd64);
      pfVar11 = Mat::operator_cast_to_float_(&local_1328);
      Mat::~Mat((Mat *)0x13a988);
      local_868 = *local_1290;
      local_1338 = CONCAT44(local_868,local_868);
      uStack_1330 = CONCAT44(local_868,local_868);
      local_888 = local_1290[1];
      local_1348 = CONCAT44(local_888,local_888);
      uStack_1340 = CONCAT44(local_888,local_888);
      local_8a8 = local_1290[2];
      local_1358 = CONCAT44(local_8a8,local_8a8);
      uStack_1350 = CONCAT44(local_8a8,local_8a8);
      local_8c8 = local_1290[3];
      local_1368 = CONCAT44(local_8c8,local_8c8);
      uStack_1360 = CONCAT44(local_8c8,local_8c8);
      local_12e8 = pfVar11;
      for (local_136c = 0; local_136c + 3 < local_113c; local_136c = local_136c + 4) {
        local_d58 = local_12a0;
        local_78 = *(undefined8 *)local_12a0;
        uStack_70 = *(undefined8 *)(local_12a0 + 2);
        local_8e8 = *local_12e8;
        local_28 = CONCAT44(local_8e8,local_8e8);
        uStack_20 = CONCAT44(local_8e8,local_8e8);
        local_908 = local_12e8[1];
        local_48 = CONCAT44(local_908,local_908);
        uStack_40 = CONCAT44(local_908,local_908);
        local_928 = local_12e8[2];
        local_68 = CONCAT44(local_928,local_928);
        uStack_60 = CONCAT44(local_928,local_928);
        local_948 = local_12e8[3];
        local_88 = CONCAT44(local_948,local_948);
        uStack_80 = CONCAT44(local_948,local_948);
        local_18._0_4_ = (float)local_78;
        local_18._4_4_ = (float)((ulong)local_78 >> 0x20);
        uStack_10._0_4_ = (float)uStack_70;
        uStack_10._4_4_ = (float)((ulong)uStack_70 >> 0x20);
        local_408 = CONCAT44(local_18._4_4_ * local_8e8,(float)local_18 * local_8e8);
        uStack_400 = CONCAT44(uStack_10._4_4_ * local_8e8,(float)uStack_10 * local_8e8);
        uVar1 = local_1338;
        uVar2 = uStack_1330;
        local_3f8._0_4_ = (float)local_1338;
        local_3f8._4_4_ = (float)((ulong)local_1338 >> 0x20);
        uStack_3f0._0_4_ = (float)uStack_1330;
        uStack_3f0._4_4_ = (float)((ulong)uStack_1330 >> 0x20);
        local_3f8._0_4_ = (float)local_3f8 + (float)local_18 * local_8e8;
        local_3f8._4_4_ = local_3f8._4_4_ + local_18._4_4_ * local_8e8;
        uStack_3f0._0_4_ = (float)uStack_3f0 + (float)uStack_10 * local_8e8;
        uStack_3f0._4_4_ = uStack_3f0._4_4_ + uStack_10._4_4_ * local_8e8;
        local_478 = CONCAT44(local_3f8._4_4_,(float)local_3f8);
        uStack_470 = CONCAT44(uStack_3f0._4_4_,(float)uStack_3f0);
        local_428 = CONCAT44(local_18._4_4_ * local_908,(float)local_18 * local_908);
        uStack_420 = CONCAT44(uStack_10._4_4_ * local_908,(float)uStack_10 * local_908);
        uVar3 = local_1348;
        uVar4 = uStack_1340;
        local_418._0_4_ = (float)local_1348;
        local_418._4_4_ = (float)((ulong)local_1348 >> 0x20);
        uStack_410._0_4_ = (float)uStack_1340;
        uStack_410._4_4_ = (float)((ulong)uStack_1340 >> 0x20);
        local_418._0_4_ = (float)local_418 + (float)local_18 * local_908;
        local_418._4_4_ = local_418._4_4_ + local_18._4_4_ * local_908;
        uStack_410._0_4_ = (float)uStack_410 + (float)uStack_10 * local_908;
        uStack_410._4_4_ = uStack_410._4_4_ + uStack_10._4_4_ * local_908;
        local_498 = CONCAT44(local_418._4_4_,(float)local_418);
        uStack_490 = CONCAT44(uStack_410._4_4_,(float)uStack_410);
        local_448 = CONCAT44(local_18._4_4_ * local_928,(float)local_18 * local_928);
        uStack_440 = CONCAT44(uStack_10._4_4_ * local_928,(float)uStack_10 * local_928);
        uVar5 = local_1358;
        uVar6 = uStack_1350;
        local_438._0_4_ = (float)local_1358;
        local_438._4_4_ = (float)((ulong)local_1358 >> 0x20);
        uStack_430._0_4_ = (float)uStack_1350;
        uStack_430._4_4_ = (float)((ulong)uStack_1350 >> 0x20);
        local_438._0_4_ = (float)local_438 + (float)local_18 * local_928;
        local_438._4_4_ = local_438._4_4_ + local_18._4_4_ * local_928;
        uStack_430._0_4_ = (float)uStack_430 + (float)uStack_10 * local_928;
        uStack_430._4_4_ = uStack_430._4_4_ + uStack_10._4_4_ * local_928;
        local_4b8 = CONCAT44(local_438._4_4_,(float)local_438);
        uStack_4b0 = CONCAT44(uStack_430._4_4_,(float)uStack_430);
        local_468 = CONCAT44(local_18._4_4_ * local_948,(float)local_18 * local_948);
        uStack_460 = CONCAT44(uStack_10._4_4_ * local_948,(float)uStack_10 * local_948);
        uVar7 = local_1368;
        uVar8 = uStack_1360;
        local_458._0_4_ = (float)local_1368;
        local_458._4_4_ = (float)((ulong)local_1368 >> 0x20);
        uStack_450._0_4_ = (float)uStack_1360;
        uStack_450._4_4_ = (float)((ulong)uStack_1360 >> 0x20);
        local_458._0_4_ = (float)local_458 + (float)local_18 * local_948;
        local_458._4_4_ = local_458._4_4_ + local_18._4_4_ * local_948;
        uStack_450._0_4_ = (float)uStack_450 + (float)uStack_10 * local_948;
        uStack_450._4_4_ = uStack_450._4_4_ + uStack_10._4_4_ * local_948;
        local_4d8 = CONCAT44(local_458._4_4_,(float)local_458);
        uStack_4d0 = CONCAT44(uStack_450._4_4_,(float)uStack_450);
        local_d60 = local_12a0 + 4;
        local_f8 = *(undefined8 *)local_d60;
        uStack_f0 = *(undefined8 *)(local_12a0 + 6);
        local_968 = local_12e8[4];
        local_a8 = CONCAT44(local_968,local_968);
        uStack_a0 = CONCAT44(local_968,local_968);
        local_988 = local_12e8[5];
        local_c8 = CONCAT44(local_988,local_988);
        uStack_c0 = CONCAT44(local_988,local_988);
        local_9a8 = local_12e8[6];
        local_e8 = CONCAT44(local_9a8,local_9a8);
        uStack_e0 = CONCAT44(local_9a8,local_9a8);
        local_9c8 = local_12e8[7];
        local_108 = CONCAT44(local_9c8,local_9c8);
        uStack_100 = CONCAT44(local_9c8,local_9c8);
        local_98._0_4_ = (float)local_f8;
        local_98._4_4_ = (float)((ulong)local_f8 >> 0x20);
        uStack_90._0_4_ = (float)uStack_f0;
        uStack_90._4_4_ = (float)((ulong)uStack_f0 >> 0x20);
        local_488 = CONCAT44(local_98._4_4_ * local_968,(float)local_98 * local_968);
        uStack_480 = CONCAT44(uStack_90._4_4_ * local_968,(float)uStack_90 * local_968);
        local_3f8._0_4_ = (float)local_3f8 + (float)local_98 * local_968;
        local_3f8._4_4_ = local_3f8._4_4_ + local_98._4_4_ * local_968;
        uStack_3f0._0_4_ = (float)uStack_3f0 + (float)uStack_90 * local_968;
        uStack_3f0._4_4_ = uStack_3f0._4_4_ + uStack_90._4_4_ * local_968;
        local_4f8 = CONCAT44(local_3f8._4_4_,(float)local_3f8);
        uStack_4f0 = CONCAT44(uStack_3f0._4_4_,(float)uStack_3f0);
        local_4a8 = CONCAT44(local_98._4_4_ * local_988,(float)local_98 * local_988);
        uStack_4a0 = CONCAT44(uStack_90._4_4_ * local_988,(float)uStack_90 * local_988);
        local_418._0_4_ = (float)local_418 + (float)local_98 * local_988;
        local_418._4_4_ = local_418._4_4_ + local_98._4_4_ * local_988;
        uStack_410._0_4_ = (float)uStack_410 + (float)uStack_90 * local_988;
        uStack_410._4_4_ = uStack_410._4_4_ + uStack_90._4_4_ * local_988;
        local_518 = CONCAT44(local_418._4_4_,(float)local_418);
        uStack_510 = CONCAT44(uStack_410._4_4_,(float)uStack_410);
        local_4c8 = CONCAT44(local_98._4_4_ * local_9a8,(float)local_98 * local_9a8);
        uStack_4c0 = CONCAT44(uStack_90._4_4_ * local_9a8,(float)uStack_90 * local_9a8);
        local_438._0_4_ = (float)local_438 + (float)local_98 * local_9a8;
        local_438._4_4_ = local_438._4_4_ + local_98._4_4_ * local_9a8;
        uStack_430._0_4_ = (float)uStack_430 + (float)uStack_90 * local_9a8;
        uStack_430._4_4_ = uStack_430._4_4_ + uStack_90._4_4_ * local_9a8;
        local_538 = CONCAT44(local_438._4_4_,(float)local_438);
        uStack_530 = CONCAT44(uStack_430._4_4_,(float)uStack_430);
        local_4e8 = CONCAT44(local_98._4_4_ * local_9c8,(float)local_98 * local_9c8);
        uStack_4e0 = CONCAT44(uStack_90._4_4_ * local_9c8,(float)uStack_90 * local_9c8);
        local_458._0_4_ = (float)local_458 + (float)local_98 * local_9c8;
        local_458._4_4_ = local_458._4_4_ + local_98._4_4_ * local_9c8;
        uStack_450._0_4_ = (float)uStack_450 + (float)uStack_90 * local_9c8;
        uStack_450._4_4_ = uStack_450._4_4_ + uStack_90._4_4_ * local_9c8;
        local_558 = CONCAT44(local_458._4_4_,(float)local_458);
        uStack_550 = CONCAT44(uStack_450._4_4_,(float)uStack_450);
        local_d68 = local_12a0 + 8;
        local_178 = *(undefined8 *)local_d68;
        uStack_170 = *(undefined8 *)(local_12a0 + 10);
        local_9e8 = local_12e8[8];
        local_128 = CONCAT44(local_9e8,local_9e8);
        uStack_120 = CONCAT44(local_9e8,local_9e8);
        local_a08 = local_12e8[9];
        local_148 = CONCAT44(local_a08,local_a08);
        uStack_140 = CONCAT44(local_a08,local_a08);
        local_a28 = local_12e8[10];
        local_168 = CONCAT44(local_a28,local_a28);
        uStack_160 = CONCAT44(local_a28,local_a28);
        local_a48 = local_12e8[0xb];
        local_188 = CONCAT44(local_a48,local_a48);
        uStack_180 = CONCAT44(local_a48,local_a48);
        local_118._0_4_ = (float)local_178;
        local_118._4_4_ = (float)((ulong)local_178 >> 0x20);
        uStack_110._0_4_ = (float)uStack_170;
        uStack_110._4_4_ = (float)((ulong)uStack_170 >> 0x20);
        local_508 = CONCAT44(local_118._4_4_ * local_9e8,(float)local_118 * local_9e8);
        uStack_500 = CONCAT44(uStack_110._4_4_ * local_9e8,(float)uStack_110 * local_9e8);
        local_3f8._0_4_ = (float)local_3f8 + (float)local_118 * local_9e8;
        local_3f8._4_4_ = local_3f8._4_4_ + local_118._4_4_ * local_9e8;
        uStack_3f0._0_4_ = (float)uStack_3f0 + (float)uStack_110 * local_9e8;
        uStack_3f0._4_4_ = uStack_3f0._4_4_ + uStack_110._4_4_ * local_9e8;
        local_578 = CONCAT44(local_3f8._4_4_,(float)local_3f8);
        uStack_570 = CONCAT44(uStack_3f0._4_4_,(float)uStack_3f0);
        local_528 = CONCAT44(local_118._4_4_ * local_a08,(float)local_118 * local_a08);
        uStack_520 = CONCAT44(uStack_110._4_4_ * local_a08,(float)uStack_110 * local_a08);
        local_418._0_4_ = (float)local_418 + (float)local_118 * local_a08;
        local_418._4_4_ = local_418._4_4_ + local_118._4_4_ * local_a08;
        uStack_410._0_4_ = (float)uStack_410 + (float)uStack_110 * local_a08;
        uStack_410._4_4_ = uStack_410._4_4_ + uStack_110._4_4_ * local_a08;
        local_598 = CONCAT44(local_418._4_4_,(float)local_418);
        uStack_590 = CONCAT44(uStack_410._4_4_,(float)uStack_410);
        local_548 = CONCAT44(local_118._4_4_ * local_a28,(float)local_118 * local_a28);
        uStack_540 = CONCAT44(uStack_110._4_4_ * local_a28,(float)uStack_110 * local_a28);
        local_438._0_4_ = (float)local_438 + (float)local_118 * local_a28;
        local_438._4_4_ = local_438._4_4_ + local_118._4_4_ * local_a28;
        uStack_430._0_4_ = (float)uStack_430 + (float)uStack_110 * local_a28;
        uStack_430._4_4_ = uStack_430._4_4_ + uStack_110._4_4_ * local_a28;
        local_5b8 = CONCAT44(local_438._4_4_,(float)local_438);
        uStack_5b0 = CONCAT44(uStack_430._4_4_,(float)uStack_430);
        local_568 = CONCAT44(local_118._4_4_ * local_a48,(float)local_118 * local_a48);
        uStack_560 = CONCAT44(uStack_110._4_4_ * local_a48,(float)uStack_110 * local_a48);
        local_458._0_4_ = (float)local_458 + (float)local_118 * local_a48;
        local_458._4_4_ = local_458._4_4_ + local_118._4_4_ * local_a48;
        uStack_450._0_4_ = (float)uStack_450 + (float)uStack_110 * local_a48;
        uStack_450._4_4_ = uStack_450._4_4_ + uStack_110._4_4_ * local_a48;
        local_5d8 = CONCAT44(local_458._4_4_,(float)local_458);
        uStack_5d0 = CONCAT44(uStack_450._4_4_,(float)uStack_450);
        local_d70 = local_12a0 + 0xc;
        local_1388 = *(undefined8 *)local_d70;
        uStack_1380 = *(undefined8 *)(local_12a0 + 0xe);
        local_a68 = local_12e8[0xc];
        local_1398 = CONCAT44(local_a68,local_a68);
        uStack_1390 = CONCAT44(local_a68,local_a68);
        local_a88 = local_12e8[0xd];
        local_13a8 = CONCAT44(local_a88,local_a88);
        uStack_13a0 = CONCAT44(local_a88,local_a88);
        local_aa8 = local_12e8[0xe];
        local_13b8 = CONCAT44(local_aa8,local_aa8);
        uStack_13b0 = CONCAT44(local_aa8,local_aa8);
        local_ac8 = local_12e8[0xf];
        local_13c8 = CONCAT44(local_ac8,local_ac8);
        uStack_13c0 = CONCAT44(local_ac8,local_ac8);
        local_198._0_4_ = (float)local_1388;
        local_198._4_4_ = (float)((ulong)local_1388 >> 0x20);
        uStack_190._0_4_ = (float)uStack_1380;
        uStack_190._4_4_ = (float)((ulong)uStack_1380 >> 0x20);
        local_588 = CONCAT44(local_198._4_4_ * local_a68,(float)local_198 * local_a68);
        uStack_580 = CONCAT44(uStack_190._4_4_ * local_a68,(float)uStack_190 * local_a68);
        local_1338 = CONCAT44(local_3f8._4_4_ + local_198._4_4_ * local_a68,
                              (float)local_3f8 + (float)local_198 * local_a68);
        uStack_1330 = CONCAT44(uStack_3f0._4_4_ + uStack_190._4_4_ * local_a68,
                               (float)uStack_3f0 + (float)uStack_190 * local_a68);
        local_5a8 = CONCAT44(local_198._4_4_ * local_a88,(float)local_198 * local_a88);
        uStack_5a0 = CONCAT44(uStack_190._4_4_ * local_a88,(float)uStack_190 * local_a88);
        local_1348 = CONCAT44(local_418._4_4_ + local_198._4_4_ * local_a88,
                              (float)local_418 + (float)local_198 * local_a88);
        uStack_1340 = CONCAT44(uStack_410._4_4_ + uStack_190._4_4_ * local_a88,
                               (float)uStack_410 + (float)uStack_190 * local_a88);
        local_5c8 = CONCAT44(local_198._4_4_ * local_aa8,(float)local_198 * local_aa8);
        uStack_5c0 = CONCAT44(uStack_190._4_4_ * local_aa8,(float)uStack_190 * local_aa8);
        local_1358 = CONCAT44(local_438._4_4_ + local_198._4_4_ * local_aa8,
                              (float)local_438 + (float)local_198 * local_aa8);
        uStack_1350 = CONCAT44(uStack_430._4_4_ + uStack_190._4_4_ * local_aa8,
                               (float)uStack_430 + (float)uStack_190 * local_aa8);
        local_5e8 = CONCAT44(local_198._4_4_ * local_ac8,(float)local_198 * local_ac8);
        uStack_5e0 = CONCAT44(uStack_190._4_4_ * local_ac8,(float)uStack_190 * local_ac8);
        local_1368 = CONCAT44(local_458._4_4_ + local_198._4_4_ * local_ac8,
                              (float)local_458 + (float)local_198 * local_ac8);
        uStack_1360 = CONCAT44(uStack_450._4_4_ + uStack_190._4_4_ * local_ac8,
                               (float)uStack_450 + (float)uStack_190 * local_ac8);
        local_12e8 = local_12e8 + 0x10;
        local_12a0 = local_12a0 + 0x10;
        fStack_ac4 = local_ac8;
        fStack_ac0 = local_ac8;
        fStack_abc = local_ac8;
        local_ab8 = local_ac8;
        fStack_aa4 = local_aa8;
        fStack_aa0 = local_aa8;
        fStack_a9c = local_aa8;
        local_a98 = local_aa8;
        fStack_a84 = local_a88;
        fStack_a80 = local_a88;
        fStack_a7c = local_a88;
        local_a78 = local_a88;
        fStack_a64 = local_a68;
        fStack_a60 = local_a68;
        fStack_a5c = local_a68;
        local_a58 = local_a68;
        fStack_a44 = local_a48;
        fStack_a40 = local_a48;
        fStack_a3c = local_a48;
        local_a38 = local_a48;
        fStack_a24 = local_a28;
        fStack_a20 = local_a28;
        fStack_a1c = local_a28;
        local_a18 = local_a28;
        fStack_a04 = local_a08;
        fStack_a00 = local_a08;
        fStack_9fc = local_a08;
        local_9f8 = local_a08;
        fStack_9e4 = local_9e8;
        fStack_9e0 = local_9e8;
        fStack_9dc = local_9e8;
        local_9d8 = local_9e8;
        fStack_9c4 = local_9c8;
        fStack_9c0 = local_9c8;
        fStack_9bc = local_9c8;
        local_9b8 = local_9c8;
        fStack_9a4 = local_9a8;
        fStack_9a0 = local_9a8;
        fStack_99c = local_9a8;
        local_998 = local_9a8;
        fStack_984 = local_988;
        fStack_980 = local_988;
        fStack_97c = local_988;
        local_978 = local_988;
        fStack_964 = local_968;
        fStack_960 = local_968;
        fStack_95c = local_968;
        local_958 = local_968;
        fStack_944 = local_948;
        fStack_940 = local_948;
        fStack_93c = local_948;
        local_938 = local_948;
        fStack_924 = local_928;
        fStack_920 = local_928;
        fStack_91c = local_928;
        local_918 = local_928;
        fStack_904 = local_908;
        fStack_900 = local_908;
        fStack_8fc = local_908;
        local_8f8 = local_908;
        fStack_8e4 = local_8e8;
        fStack_8e0 = local_8e8;
        fStack_8dc = local_8e8;
        local_8d8 = local_8e8;
        local_458 = uVar7;
        uStack_450 = uVar8;
        local_438 = uVar5;
        uStack_430 = uVar6;
        local_418 = uVar3;
        uStack_410 = uVar4;
        local_3f8 = uVar1;
        uStack_3f0 = uVar2;
        local_208 = local_13c8;
        uStack_200 = uStack_13c0;
        local_1f8 = local_1388;
        uStack_1f0 = uStack_1380;
        local_1e8 = local_13b8;
        uStack_1e0 = uStack_13b0;
        local_1d8 = local_1388;
        uStack_1d0 = uStack_1380;
        local_1c8 = local_13a8;
        uStack_1c0 = uStack_13a0;
        local_1b8 = local_1388;
        uStack_1b0 = uStack_1380;
        local_1a8 = local_1398;
        uStack_1a0 = uStack_1390;
        local_198 = local_1388;
        uStack_190 = uStack_1380;
        local_158 = local_178;
        uStack_150 = uStack_170;
        local_138 = local_178;
        uStack_130 = uStack_170;
        local_118 = local_178;
        uStack_110 = uStack_170;
        local_d8 = local_f8;
        uStack_d0 = uStack_f0;
        local_b8 = local_f8;
        uStack_b0 = uStack_f0;
        local_98 = local_f8;
        uStack_90 = uStack_f0;
        local_58 = local_78;
        uStack_50 = uStack_70;
        local_38 = local_78;
        uStack_30 = uStack_70;
        local_18 = local_78;
        uStack_10 = uStack_70;
      }
      for (; local_136c < local_113c; local_136c = local_136c + 1) {
        local_d78 = local_12a0;
        local_13d8 = *(undefined8 *)local_12a0;
        uStack_13d0 = *(undefined8 *)(local_12a0 + 2);
        local_ae8 = *local_12e8;
        local_13e8 = CONCAT44(local_ae8,local_ae8);
        uStack_13e0 = CONCAT44(local_ae8,local_ae8);
        local_b08 = local_12e8[1];
        local_13f8 = CONCAT44(local_b08,local_b08);
        uStack_13f0 = CONCAT44(local_b08,local_b08);
        local_b28 = local_12e8[2];
        local_1408 = CONCAT44(local_b28,local_b28);
        uStack_1400 = CONCAT44(local_b28,local_b28);
        local_b48 = local_12e8[3];
        local_1418 = CONCAT44(local_b48,local_b48);
        uStack_1410 = CONCAT44(local_b48,local_b48);
        local_218._0_4_ = (float)local_13d8;
        local_218._4_4_ = (float)((ulong)local_13d8 >> 0x20);
        uStack_210._0_4_ = (float)uStack_13d0;
        uStack_210._4_4_ = (float)((ulong)uStack_13d0 >> 0x20);
        local_608 = CONCAT44(local_218._4_4_ * local_ae8,(float)local_218 * local_ae8);
        uStack_600 = CONCAT44(uStack_210._4_4_ * local_ae8,(float)uStack_210 * local_ae8);
        uVar1 = local_1338;
        uVar2 = uStack_1330;
        local_5f8._0_4_ = (float)local_1338;
        local_5f8._4_4_ = (float)((ulong)local_1338 >> 0x20);
        uStack_5f0._0_4_ = (float)uStack_1330;
        uStack_5f0._4_4_ = (float)((ulong)uStack_1330 >> 0x20);
        local_1338 = CONCAT44(local_5f8._4_4_ + local_218._4_4_ * local_ae8,
                              (float)local_5f8 + (float)local_218 * local_ae8);
        uStack_1330 = CONCAT44(uStack_5f0._4_4_ + uStack_210._4_4_ * local_ae8,
                               (float)uStack_5f0 + (float)uStack_210 * local_ae8);
        local_628 = CONCAT44(local_218._4_4_ * local_b08,(float)local_218 * local_b08);
        uStack_620 = CONCAT44(uStack_210._4_4_ * local_b08,(float)uStack_210 * local_b08);
        uVar3 = local_1348;
        uVar4 = uStack_1340;
        local_618._0_4_ = (float)local_1348;
        local_618._4_4_ = (float)((ulong)local_1348 >> 0x20);
        uStack_610._0_4_ = (float)uStack_1340;
        uStack_610._4_4_ = (float)((ulong)uStack_1340 >> 0x20);
        local_1348 = CONCAT44(local_618._4_4_ + local_218._4_4_ * local_b08,
                              (float)local_618 + (float)local_218 * local_b08);
        uStack_1340 = CONCAT44(uStack_610._4_4_ + uStack_210._4_4_ * local_b08,
                               (float)uStack_610 + (float)uStack_210 * local_b08);
        local_648 = CONCAT44(local_218._4_4_ * local_b28,(float)local_218 * local_b28);
        uStack_640 = CONCAT44(uStack_210._4_4_ * local_b28,(float)uStack_210 * local_b28);
        uVar5 = local_1358;
        uVar6 = uStack_1350;
        local_638._0_4_ = (float)local_1358;
        local_638._4_4_ = (float)((ulong)local_1358 >> 0x20);
        uStack_630._0_4_ = (float)uStack_1350;
        uStack_630._4_4_ = (float)((ulong)uStack_1350 >> 0x20);
        local_1358 = CONCAT44(local_638._4_4_ + local_218._4_4_ * local_b28,
                              (float)local_638 + (float)local_218 * local_b28);
        uStack_1350 = CONCAT44(uStack_630._4_4_ + uStack_210._4_4_ * local_b28,
                               (float)uStack_630 + (float)uStack_210 * local_b28);
        local_668 = CONCAT44(local_218._4_4_ * local_b48,(float)local_218 * local_b48);
        uStack_660 = CONCAT44(uStack_210._4_4_ * local_b48,(float)uStack_210 * local_b48);
        uVar7 = local_1368;
        uVar8 = uStack_1360;
        local_658._0_4_ = (float)local_1368;
        local_658._4_4_ = (float)((ulong)local_1368 >> 0x20);
        uStack_650._0_4_ = (float)uStack_1360;
        uStack_650._4_4_ = (float)((ulong)uStack_1360 >> 0x20);
        local_1368 = CONCAT44(local_658._4_4_ + local_218._4_4_ * local_b48,
                              (float)local_658 + (float)local_218 * local_b48);
        uStack_1360 = CONCAT44(uStack_650._4_4_ + uStack_210._4_4_ * local_b48,
                               (float)uStack_650 + (float)uStack_210 * local_b48);
        local_12e8 = local_12e8 + 4;
        local_12a0 = local_12a0 + 4;
        fStack_b44 = local_b48;
        fStack_b40 = local_b48;
        fStack_b3c = local_b48;
        local_b38 = local_b48;
        fStack_b24 = local_b28;
        fStack_b20 = local_b28;
        fStack_b1c = local_b28;
        local_b18 = local_b28;
        fStack_b04 = local_b08;
        fStack_b00 = local_b08;
        fStack_afc = local_b08;
        local_af8 = local_b08;
        fStack_ae4 = local_ae8;
        fStack_ae0 = local_ae8;
        fStack_adc = local_ae8;
        local_ad8 = local_ae8;
        local_658 = uVar7;
        uStack_650 = uVar8;
        local_638 = uVar5;
        uStack_630 = uVar6;
        local_618 = uVar3;
        uStack_610 = uVar4;
        local_5f8 = uVar1;
        uStack_5f0 = uVar2;
        local_288 = local_1418;
        uStack_280 = uStack_1410;
        local_278 = local_13d8;
        uStack_270 = uStack_13d0;
        local_268 = local_1408;
        uStack_260 = uStack_1400;
        local_258 = local_13d8;
        uStack_250 = uStack_13d0;
        local_248 = local_13f8;
        uStack_240 = uStack_13f0;
        local_238 = local_13d8;
        uStack_230 = uStack_13d0;
        local_228 = local_13e8;
        uStack_220 = uStack_13e0;
        local_218 = local_13d8;
        uStack_210 = uStack_13d0;
      }
      local_e00 = local_1158;
      local_e18 = local_1338;
      uStack_e10 = uStack_1330;
      *(undefined8 *)local_1158 = local_1338;
      *(undefined8 *)(local_1158 + 2) = uStack_1330;
      local_e20 = local_11a0;
      local_e38 = local_1348;
      uStack_e30 = uStack_1340;
      *(undefined8 *)local_11a0 = local_1348;
      *(undefined8 *)(local_11a0 + 2) = uStack_1340;
      local_e40 = local_11e8;
      local_e58 = local_1358;
      uStack_e50 = uStack_1350;
      *(undefined8 *)local_11e8 = local_1358;
      *(undefined8 *)(local_11e8 + 2) = uStack_1350;
      local_e60 = local_1230;
      local_e78 = local_1368;
      uStack_e70 = uStack_1360;
      *(undefined8 *)local_1230 = local_1368;
      *(undefined8 *)(local_1230 + 2) = uStack_1360;
      local_1158 = local_1158 + 4;
      local_11a0 = local_11a0 + 4;
      local_11e8 = local_11e8 + 4;
      local_1230 = local_1230 + 4;
      fStack_8c4 = local_8c8;
      fStack_8c0 = local_8c8;
      fStack_8bc = local_8c8;
      local_8b8 = local_8c8;
      fStack_8a4 = local_8a8;
      fStack_8a0 = local_8a8;
      fStack_89c = local_8a8;
      local_898 = local_8a8;
      fStack_884 = local_888;
      fStack_880 = local_888;
      fStack_87c = local_888;
      local_878 = local_888;
      fStack_864 = local_868;
      fStack_860 = local_868;
      fStack_85c = local_868;
      local_858 = local_868;
    }
    for (; local_1294 < local_1138; local_1294 = local_1294 + 1) {
      Mat::channel(in_stack_ffffffffffffdd68,(int)in_stack_ffffffffffffdd64);
      pfVar11 = Mat::operator_cast_to_float_(&local_1460);
      Mat::~Mat((Mat *)0x13c00a);
      local_1420 = pfVar11;
      Mat::channel(in_stack_ffffffffffffdd68,(int)in_stack_ffffffffffffdd64);
      pfVar11 = Mat::operator_cast_to_float_(&local_14a8);
      Mat::~Mat((Mat *)0x13c069);
      local_d80 = local_1290;
      uVar1 = *(undefined8 *)local_1290;
      uVar2 = *(undefined8 *)(local_1290 + 2);
      local_b58 = 0;
      local_b68 = 0;
      local_14c8 = 0;
      uStack_14c0 = 0;
      local_b78 = 0;
      local_b88 = 0;
      local_14d8 = 0;
      uStack_14d0 = 0;
      local_b98 = 0;
      local_ba8 = 0;
      local_14e8 = 0;
      uStack_14e0 = 0;
      local_bb8 = 0;
      local_bc8 = 0;
      local_14f8 = 0;
      uStack_14f0 = 0;
      local_14fc = 0;
      local_1468 = pfVar11;
      while( true ) {
        uVar10 = uStack_670;
        uVar9 = local_678;
        uVar8 = uStack_690;
        uVar7 = local_698;
        uVar6 = uStack_6b0;
        uVar5 = local_6b8;
        uVar4 = uStack_6d0;
        uVar3 = local_6d8;
        local_678._0_4_ = (float)local_14c8;
        local_678._4_4_ = (float)((ulong)local_14c8 >> 0x20);
        uStack_670._0_4_ = (float)uStack_14c0;
        uStack_670._4_4_ = (float)((ulong)uStack_14c0 >> 0x20);
        local_698._0_4_ = (float)local_14d8;
        local_698._4_4_ = (float)((ulong)local_14d8 >> 0x20);
        uStack_690._0_4_ = (float)uStack_14d0;
        uStack_690._4_4_ = (float)((ulong)uStack_14d0 >> 0x20);
        local_6b8._0_4_ = (float)local_14e8;
        local_6b8._4_4_ = (float)((ulong)local_14e8 >> 0x20);
        uStack_6b0._0_4_ = (float)uStack_14e0;
        uStack_6b0._4_4_ = (float)((ulong)uStack_14e0 >> 0x20);
        local_6d8._0_4_ = (float)local_14f8;
        local_6d8._4_4_ = (float)((ulong)local_14f8 >> 0x20);
        uStack_6d0._0_4_ = (float)uStack_14f0;
        uStack_6d0._4_4_ = (float)((ulong)uStack_14f0 >> 0x20);
        if (local_113c <= local_14fc + 3) break;
        local_be8 = *local_1420;
        local_1518 = CONCAT44(local_be8,local_be8);
        uStack_1510 = CONCAT44(local_be8,local_be8);
        local_c08 = local_1420[1];
        local_1528 = CONCAT44(local_c08,local_c08);
        uStack_1520 = CONCAT44(local_c08,local_c08);
        local_c28 = local_1420[2];
        local_1538 = CONCAT44(local_c28,local_c28);
        uStack_1530 = CONCAT44(local_c28,local_c28);
        local_c48 = local_1420[3];
        local_1548 = CONCAT44(local_c48,local_c48);
        uStack_1540 = CONCAT44(local_c48,local_c48);
        local_d88 = local_1468;
        local_1558 = *(undefined8 *)local_1468;
        uStack_1550 = *(undefined8 *)(local_1468 + 2);
        local_d90 = local_1468 + 4;
        local_1568 = *(undefined8 *)local_d90;
        uStack_1560 = *(undefined8 *)(local_1468 + 6);
        local_d98 = local_1468 + 8;
        local_1578 = *(undefined8 *)local_d98;
        uStack_1570 = *(undefined8 *)(local_1468 + 10);
        local_da0 = local_1468 + 0xc;
        local_1588 = *(undefined8 *)local_da0;
        uStack_1580 = *(undefined8 *)(local_1468 + 0xe);
        local_298._0_4_ = (float)local_1558;
        local_298._4_4_ = (float)((ulong)local_1558 >> 0x20);
        uStack_290._0_4_ = (float)uStack_1550;
        uStack_290._4_4_ = (float)((ulong)uStack_1550 >> 0x20);
        local_688 = CONCAT44(local_298._4_4_ * local_be8,(float)local_298 * local_be8);
        uStack_680 = CONCAT44(uStack_290._4_4_ * local_be8,(float)uStack_290 * local_be8);
        uVar3 = local_14c8;
        uVar4 = uStack_14c0;
        local_14c8 = CONCAT44(local_678._4_4_ + local_298._4_4_ * local_be8,
                              (float)local_678 + (float)local_298 * local_be8);
        uStack_14c0 = CONCAT44(uStack_670._4_4_ + uStack_290._4_4_ * local_be8,
                               (float)uStack_670 + (float)uStack_290 * local_be8);
        local_2b8._0_4_ = (float)local_1568;
        local_2b8._4_4_ = (float)((ulong)local_1568 >> 0x20);
        uStack_2b0._0_4_ = (float)uStack_1560;
        uStack_2b0._4_4_ = (float)((ulong)uStack_1560 >> 0x20);
        local_6a8 = CONCAT44(local_2b8._4_4_ * local_c08,(float)local_2b8 * local_c08);
        uStack_6a0 = CONCAT44(uStack_2b0._4_4_ * local_c08,(float)uStack_2b0 * local_c08);
        uVar5 = local_14d8;
        uVar6 = uStack_14d0;
        local_14d8 = CONCAT44(local_698._4_4_ + local_2b8._4_4_ * local_c08,
                              (float)local_698 + (float)local_2b8 * local_c08);
        uStack_14d0 = CONCAT44(uStack_690._4_4_ + uStack_2b0._4_4_ * local_c08,
                               (float)uStack_690 + (float)uStack_2b0 * local_c08);
        local_2d8._0_4_ = (float)local_1578;
        local_2d8._4_4_ = (float)((ulong)local_1578 >> 0x20);
        uStack_2d0._0_4_ = (float)uStack_1570;
        uStack_2d0._4_4_ = (float)((ulong)uStack_1570 >> 0x20);
        local_6c8 = CONCAT44(local_2d8._4_4_ * local_c28,(float)local_2d8 * local_c28);
        uStack_6c0 = CONCAT44(uStack_2d0._4_4_ * local_c28,(float)uStack_2d0 * local_c28);
        uVar7 = local_14e8;
        uVar8 = uStack_14e0;
        local_14e8 = CONCAT44(local_6b8._4_4_ + local_2d8._4_4_ * local_c28,
                              (float)local_6b8 + (float)local_2d8 * local_c28);
        uStack_14e0 = CONCAT44(uStack_6b0._4_4_ + uStack_2d0._4_4_ * local_c28,
                               (float)uStack_6b0 + (float)uStack_2d0 * local_c28);
        local_2f8._0_4_ = (float)local_1588;
        local_2f8._4_4_ = (float)((ulong)local_1588 >> 0x20);
        uStack_2f0._0_4_ = (float)uStack_1580;
        uStack_2f0._4_4_ = (float)((ulong)uStack_1580 >> 0x20);
        local_6e8 = CONCAT44(local_2f8._4_4_ * local_c48,(float)local_2f8 * local_c48);
        uStack_6e0 = CONCAT44(uStack_2f0._4_4_ * local_c48,(float)uStack_2f0 * local_c48);
        uVar9 = local_14f8;
        uVar10 = uStack_14f0;
        local_14f8 = CONCAT44(local_6d8._4_4_ + local_2f8._4_4_ * local_c48,
                              (float)local_6d8 + (float)local_2f8 * local_c48);
        uStack_14f0 = CONCAT44(uStack_6d0._4_4_ + uStack_2f0._4_4_ * local_c48,
                               (float)uStack_6d0 + (float)uStack_2f0 * local_c48);
        local_1468 = local_1468 + 0x10;
        local_1420 = local_1420 + 4;
        local_14fc = local_14fc + 4;
        fStack_c44 = local_c48;
        fStack_c40 = local_c48;
        fStack_c3c = local_c48;
        local_c38 = local_c48;
        fStack_c24 = local_c28;
        fStack_c20 = local_c28;
        fStack_c1c = local_c28;
        local_c18 = local_c28;
        fStack_c04 = local_c08;
        fStack_c00 = local_c08;
        fStack_bfc = local_c08;
        local_bf8 = local_c08;
        fStack_be4 = local_be8;
        fStack_be0 = local_be8;
        fStack_bdc = local_be8;
        local_bd8 = local_be8;
        local_6d8 = uVar9;
        uStack_6d0 = uVar10;
        local_6b8 = uVar7;
        uStack_6b0 = uVar8;
        local_698 = uVar5;
        uStack_690 = uVar6;
        local_678 = uVar3;
        uStack_670 = uVar4;
        local_308 = local_1548;
        uStack_300 = uStack_1540;
        local_2f8 = local_1588;
        uStack_2f0 = uStack_1580;
        local_2e8 = local_1538;
        uStack_2e0 = uStack_1530;
        local_2d8 = local_1578;
        uStack_2d0 = uStack_1570;
        local_2c8 = local_1528;
        uStack_2c0 = uStack_1520;
        local_2b8 = local_1568;
        uStack_2b0 = uStack_1560;
        local_2a8 = local_1518;
        uStack_2a0 = uStack_1510;
        local_298 = local_1558;
        uStack_290 = uStack_1550;
      }
      local_6f8 = local_14c8;
      uStack_6f0 = uStack_14c0;
      local_708 = local_14d8;
      uStack_700 = uStack_14d0;
      local_14c8 = CONCAT44(local_678._4_4_ + local_698._4_4_,(float)local_678 + (float)local_698);
      uStack_14c0 = CONCAT44(uStack_670._4_4_ + uStack_690._4_4_,
                             (float)uStack_670 + (float)uStack_690);
      local_718 = local_14e8;
      uStack_710 = uStack_14e0;
      local_728 = local_14f8;
      uStack_720 = uStack_14f0;
      local_14e8 = CONCAT44(local_6b8._4_4_ + local_6d8._4_4_,(float)local_6b8 + (float)local_6d8);
      uStack_14e0 = CONCAT44(uStack_6b0._4_4_ + uStack_6d0._4_4_,
                             (float)uStack_6b0 + (float)uStack_6d0);
      local_738._0_4_ = (float)uVar1;
      local_738._4_4_ = (float)((ulong)uVar1 >> 0x20);
      uStack_730._0_4_ = (float)uVar2;
      uStack_730._4_4_ = (float)((ulong)uVar2 >> 0x20);
      local_738._0_4_ = (float)local_738 + (float)local_678 + (float)local_698;
      local_738._4_4_ = local_738._4_4_ + local_678._4_4_ + local_698._4_4_;
      uStack_730._0_4_ = (float)uStack_730 + (float)uStack_670 + (float)uStack_690;
      uStack_730._4_4_ = uStack_730._4_4_ + uStack_670._4_4_ + uStack_690._4_4_;
      local_758 = CONCAT44(local_738._4_4_,(float)local_738);
      uStack_750 = CONCAT44(uStack_730._4_4_,(float)uStack_730);
      local_14b8 = CONCAT44(local_738._4_4_ + local_6b8._4_4_ + local_6d8._4_4_,
                            (float)local_738 + (float)local_6b8 + (float)local_6d8);
      uStack_14b0 = CONCAT44(uStack_730._4_4_ + uStack_6b0._4_4_ + uStack_6d0._4_4_,
                             (float)uStack_730 + (float)uStack_6b0 + (float)uStack_6d0);
      while( true ) {
        if (local_113c <= local_14fc) break;
        local_c68 = *local_1420;
        local_1598 = CONCAT44(local_c68,local_c68);
        uStack_1590 = CONCAT44(local_c68,local_c68);
        local_da8 = local_1468;
        local_15a8 = *(undefined8 *)local_1468;
        uStack_15a0 = *(undefined8 *)(local_1468 + 2);
        local_318._0_4_ = (float)local_15a8;
        local_318._4_4_ = (float)((ulong)local_15a8 >> 0x20);
        uStack_310._0_4_ = (float)uStack_15a0;
        uStack_310._4_4_ = (float)((ulong)uStack_15a0 >> 0x20);
        local_788 = CONCAT44(local_318._4_4_ * local_c68,(float)local_318 * local_c68);
        uStack_780 = CONCAT44(uStack_310._4_4_ * local_c68,(float)uStack_310 * local_c68);
        local_778 = local_14b8;
        uStack_770 = uStack_14b0;
        local_14b8 = CONCAT44(local_14b8._4_4_ + local_318._4_4_ * local_c68,
                              (float)local_14b8 + (float)local_318 * local_c68);
        uStack_14b0 = CONCAT44(uStack_14b0._4_4_ + uStack_310._4_4_ * local_c68,
                               (float)uStack_14b0 + (float)uStack_310 * local_c68);
        local_1468 = local_1468 + 4;
        local_1420 = local_1420 + 1;
        local_14fc = local_14fc + 1;
        fStack_c64 = local_c68;
        fStack_c60 = local_c68;
        fStack_c5c = local_c68;
        local_c58 = local_c68;
        local_328 = local_1598;
        uStack_320 = uStack_1590;
        local_318 = local_15a8;
        uStack_310 = uStack_15a0;
      }
      *local_1158 = (float)local_14b8;
      *local_11a0 = local_14b8._4_4_;
      *local_11e8 = (float)uStack_14b0;
      *local_1230 = uStack_14b0._4_4_;
      local_1158 = local_1158 + 1;
      local_11a0 = local_11a0 + 1;
      local_11e8 = local_11e8 + 1;
      local_1230 = local_1230 + 1;
      uStack_bc4 = local_bc8;
      uStack_bc0 = local_bc8;
      uStack_bbc = local_bc8;
      uStack_ba4 = local_ba8;
      uStack_ba0 = local_ba8;
      uStack_b9c = local_ba8;
      uStack_b84 = local_b88;
      uStack_b80 = local_b88;
      uStack_b7c = local_b88;
      uStack_b64 = local_b68;
      uStack_b60 = local_b68;
      uStack_b5c = local_b68;
      local_768 = local_14e8;
      uStack_760 = uStack_14e0;
      local_748 = local_14c8;
      uStack_740 = uStack_14c0;
      local_738 = uVar1;
      uStack_730 = uVar2;
      local_6d8 = uVar3;
      uStack_6d0 = uVar4;
      local_6b8 = uVar5;
      uStack_6b0 = uVar6;
      local_698 = uVar7;
      uStack_690 = uVar8;
      local_678 = uVar9;
      uStack_670 = uVar10;
    }
  }
  for (local_15ac = local_1144; local_15ac < local_edc; local_15ac = local_15ac + 1) {
    Mat::channel(in_stack_ffffffffffffdd68,(int)in_stack_ffffffffffffdd64);
    pfVar11 = Mat::operator_cast_to_float_(&local_15f8);
    Mat::~Mat((Mat *)0x13ca51);
    if (local_ee8 == (float *)0x0) {
      local_2084 = 0.0;
    }
    else {
      local_2084 = local_ee8[local_15ac];
    }
    local_15fc = local_2084;
    local_15b8 = pfVar11;
    for (local_1600 = 0; local_1600 + 3 < local_1138; local_1600 = local_1600 + 4) {
      Mat::channel(in_stack_ffffffffffffdd68,(int)in_stack_ffffffffffffdd64);
      pfVar11 = Mat::operator_cast_to_float_(&local_1648);
      Mat::~Mat((Mat *)0x13cb1d);
      local_1608 = pfVar11;
      Mat::channel(in_stack_ffffffffffffdd68,(int)in_stack_ffffffffffffdd64);
      pfVar11 = Mat::operator_cast_to_float_(&local_1690);
      Mat::~Mat((Mat *)0x13cb87);
      local_c78 = local_15fc;
      local_c88 = local_15fc;
      local_16a8 = CONCAT44(local_15fc,local_15fc);
      uStack_16a0 = CONCAT44(local_15fc,local_15fc);
      local_1650 = pfVar11;
      for (local_16ac = 0; local_16ac + 3 < local_113c; local_16ac = local_16ac + 4) {
        local_ca8 = *local_1650;
        local_16c8 = CONCAT44(local_ca8,local_ca8);
        uStack_16c0 = CONCAT44(local_ca8,local_ca8);
        local_cc8 = local_1650[1];
        local_16d8 = CONCAT44(local_cc8,local_cc8);
        uStack_16d0 = CONCAT44(local_cc8,local_cc8);
        local_ce8 = local_1650[2];
        local_16e8 = CONCAT44(local_ce8,local_ce8);
        uStack_16e0 = CONCAT44(local_ce8,local_ce8);
        local_d08 = local_1650[3];
        local_16f8 = CONCAT44(local_d08,local_d08);
        uStack_16f0 = CONCAT44(local_d08,local_d08);
        local_db0 = local_1608;
        local_1708 = *(undefined8 *)local_1608;
        uStack_1700 = *(undefined8 *)(local_1608 + 2);
        local_db8 = local_1608 + 4;
        local_1718 = *(undefined8 *)local_db8;
        uStack_1710 = *(undefined8 *)(local_1608 + 6);
        local_dc0 = local_1608 + 8;
        local_1728 = *(undefined8 *)local_dc0;
        uStack_1720 = *(undefined8 *)(local_1608 + 10);
        local_dc8 = local_1608 + 0xc;
        local_1738 = *(undefined8 *)local_dc8;
        uStack_1730 = *(undefined8 *)(local_1608 + 0xe);
        local_338._0_4_ = (float)local_1708;
        local_338._4_4_ = (float)((ulong)local_1708 >> 0x20);
        uStack_330._0_4_ = (float)uStack_1700;
        uStack_330._4_4_ = (float)((ulong)uStack_1700 >> 0x20);
        local_7a8 = CONCAT44(local_338._4_4_ * local_ca8,(float)local_338 * local_ca8);
        uStack_7a0 = CONCAT44(uStack_330._4_4_ * local_ca8,(float)uStack_330 * local_ca8);
        uVar1 = local_16a8;
        uVar2 = uStack_16a0;
        local_798._0_4_ = (float)local_16a8;
        local_798._4_4_ = (float)((ulong)local_16a8 >> 0x20);
        uStack_790._0_4_ = (float)uStack_16a0;
        uStack_790._4_4_ = (float)((ulong)uStack_16a0 >> 0x20);
        local_798._0_4_ = (float)local_798 + (float)local_338 * local_ca8;
        local_798._4_4_ = local_798._4_4_ + local_338._4_4_ * local_ca8;
        uStack_790._0_4_ = (float)uStack_790 + (float)uStack_330 * local_ca8;
        uStack_790._4_4_ = uStack_790._4_4_ + uStack_330._4_4_ * local_ca8;
        local_7b8 = CONCAT44(local_798._4_4_,(float)local_798);
        uStack_7b0 = CONCAT44(uStack_790._4_4_,(float)uStack_790);
        local_358._0_4_ = (float)local_1718;
        local_358._4_4_ = (float)((ulong)local_1718 >> 0x20);
        uStack_350._0_4_ = (float)uStack_1710;
        uStack_350._4_4_ = (float)((ulong)uStack_1710 >> 0x20);
        local_7c8 = CONCAT44(local_358._4_4_ * local_cc8,(float)local_358 * local_cc8);
        uStack_7c0 = CONCAT44(uStack_350._4_4_ * local_cc8,(float)uStack_350 * local_cc8);
        local_798._0_4_ = (float)local_798 + (float)local_358 * local_cc8;
        local_798._4_4_ = local_798._4_4_ + local_358._4_4_ * local_cc8;
        uStack_790._0_4_ = (float)uStack_790 + (float)uStack_350 * local_cc8;
        uStack_790._4_4_ = uStack_790._4_4_ + uStack_350._4_4_ * local_cc8;
        local_7d8 = CONCAT44(local_798._4_4_,(float)local_798);
        uStack_7d0 = CONCAT44(uStack_790._4_4_,(float)uStack_790);
        local_378._0_4_ = (float)local_1728;
        local_378._4_4_ = (float)((ulong)local_1728 >> 0x20);
        uStack_370._0_4_ = (float)uStack_1720;
        uStack_370._4_4_ = (float)((ulong)uStack_1720 >> 0x20);
        local_7e8 = CONCAT44(local_378._4_4_ * local_ce8,(float)local_378 * local_ce8);
        uStack_7e0 = CONCAT44(uStack_370._4_4_ * local_ce8,(float)uStack_370 * local_ce8);
        local_798._0_4_ = (float)local_798 + (float)local_378 * local_ce8;
        local_798._4_4_ = local_798._4_4_ + local_378._4_4_ * local_ce8;
        uStack_790._0_4_ = (float)uStack_790 + (float)uStack_370 * local_ce8;
        uStack_790._4_4_ = uStack_790._4_4_ + uStack_370._4_4_ * local_ce8;
        local_7f8 = CONCAT44(local_798._4_4_,(float)local_798);
        uStack_7f0 = CONCAT44(uStack_790._4_4_,(float)uStack_790);
        local_398._0_4_ = (float)local_1738;
        local_398._4_4_ = (float)((ulong)local_1738 >> 0x20);
        uStack_390._0_4_ = (float)uStack_1730;
        uStack_390._4_4_ = (float)((ulong)uStack_1730 >> 0x20);
        local_808 = CONCAT44(local_398._4_4_ * local_d08,(float)local_398 * local_d08);
        uStack_800 = CONCAT44(uStack_390._4_4_ * local_d08,(float)uStack_390 * local_d08);
        local_16a8 = CONCAT44(local_798._4_4_ + local_398._4_4_ * local_d08,
                              (float)local_798 + (float)local_398 * local_d08);
        uStack_16a0 = CONCAT44(uStack_790._4_4_ + uStack_390._4_4_ * local_d08,
                               (float)uStack_790 + (float)uStack_390 * local_d08);
        local_1650 = local_1650 + 4;
        local_1608 = local_1608 + 0x10;
        fStack_d04 = local_d08;
        fStack_d00 = local_d08;
        fStack_cfc = local_d08;
        local_cf8 = local_d08;
        fStack_ce4 = local_ce8;
        fStack_ce0 = local_ce8;
        fStack_cdc = local_ce8;
        local_cd8 = local_ce8;
        fStack_cc4 = local_cc8;
        fStack_cc0 = local_cc8;
        fStack_cbc = local_cc8;
        local_cb8 = local_cc8;
        fStack_ca4 = local_ca8;
        fStack_ca0 = local_ca8;
        fStack_c9c = local_ca8;
        local_c98 = local_ca8;
        local_798 = uVar1;
        uStack_790 = uVar2;
        local_3a8 = local_16f8;
        uStack_3a0 = uStack_16f0;
        local_398 = local_1738;
        uStack_390 = uStack_1730;
        local_388 = local_16e8;
        uStack_380 = uStack_16e0;
        local_378 = local_1728;
        uStack_370 = uStack_1720;
        local_368 = local_16d8;
        uStack_360 = uStack_16d0;
        local_358 = local_1718;
        uStack_350 = uStack_1710;
        local_348 = local_16c8;
        uStack_340 = uStack_16c0;
        local_338 = local_1708;
        uStack_330 = uStack_1700;
      }
      for (; local_16ac < local_113c; local_16ac = local_16ac + 1) {
        local_d28 = *local_1650;
        local_1748 = CONCAT44(local_d28,local_d28);
        uStack_1740 = CONCAT44(local_d28,local_d28);
        local_dd0 = local_1608;
        local_1758 = *(undefined8 *)local_1608;
        uStack_1750 = *(undefined8 *)(local_1608 + 2);
        local_3b8._0_4_ = (float)local_1758;
        local_3b8._4_4_ = (float)((ulong)local_1758 >> 0x20);
        uStack_3b0._0_4_ = (float)uStack_1750;
        uStack_3b0._4_4_ = (float)((ulong)uStack_1750 >> 0x20);
        local_828 = CONCAT44(local_3b8._4_4_ * local_d28,(float)local_3b8 * local_d28);
        uStack_820 = CONCAT44(uStack_3b0._4_4_ * local_d28,(float)uStack_3b0 * local_d28);
        uVar1 = local_16a8;
        uVar2 = uStack_16a0;
        local_818._0_4_ = (float)local_16a8;
        local_818._4_4_ = (float)((ulong)local_16a8 >> 0x20);
        uStack_810._0_4_ = (float)uStack_16a0;
        uStack_810._4_4_ = (float)((ulong)uStack_16a0 >> 0x20);
        local_16a8 = CONCAT44(local_818._4_4_ + local_3b8._4_4_ * local_d28,
                              (float)local_818 + (float)local_3b8 * local_d28);
        uStack_16a0 = CONCAT44(uStack_810._4_4_ + uStack_3b0._4_4_ * local_d28,
                               (float)uStack_810 + (float)uStack_3b0 * local_d28);
        local_1650 = local_1650 + 1;
        local_1608 = local_1608 + 4;
        fStack_d24 = local_d28;
        fStack_d20 = local_d28;
        fStack_d1c = local_d28;
        local_d18 = local_d28;
        local_818 = uVar1;
        uStack_810 = uVar2;
        local_3c8 = local_1748;
        uStack_3c0 = uStack_1740;
        local_3b8 = local_1758;
        uStack_3b0 = uStack_1750;
      }
      local_e80 = local_15b8;
      local_e98 = local_16a8;
      uStack_e90 = uStack_16a0;
      *(undefined8 *)local_15b8 = local_16a8;
      *(undefined8 *)(local_15b8 + 2) = uStack_16a0;
      local_15b8 = local_15b8 + 4;
      fStack_c84 = local_c88;
      fStack_c80 = local_c88;
      fStack_c7c = local_c88;
    }
    for (; local_1600 < local_1138; local_1600 = local_1600 + 1) {
      Mat::channel(in_stack_ffffffffffffdd68,(int)in_stack_ffffffffffffdd64);
      pfVar11 = Mat::operator_cast_to_float_(&local_17a0);
      Mat::~Mat((Mat *)0x13d312);
      local_1760 = pfVar11;
      Mat::channel(in_stack_ffffffffffffdd68,(int)in_stack_ffffffffffffdd64);
      pfVar11 = Mat::operator_cast_to_float_(&local_17e8);
      Mat::~Mat((Mat *)0x13d376);
      local_17ec = 0;
      local_d38 = 0;
      local_d48 = 0;
      uStack_1800 = 0;
      local_1808 = (Mat *)0x0;
      local_17a8 = pfVar11;
      while( true ) {
        if (local_113c <= local_17ec + 3) break;
        local_dd8 = local_1760;
        uVar1 = *(undefined8 *)local_1760;
        uVar2 = *(undefined8 *)(local_1760 + 2);
        local_de0 = local_17a8;
        uVar3 = *(undefined8 *)local_17a8;
        uVar4 = *(undefined8 *)(local_17a8 + 2);
        local_3d8._0_4_ = (float)uVar1;
        local_3d8._4_4_ = (float)((ulong)uVar1 >> 0x20);
        uStack_3d0._0_4_ = (float)uVar2;
        uStack_3d0._4_4_ = (float)((ulong)uVar2 >> 0x20);
        local_3e8._0_4_ = (float)uVar3;
        local_3e8._4_4_ = (float)((ulong)uVar3 >> 0x20);
        uStack_3e0._0_4_ = (float)uVar4;
        uStack_3e0._4_4_ = (float)((ulong)uVar4 >> 0x20);
        local_848 = CONCAT44(local_3d8._4_4_ * local_3e8._4_4_,(float)local_3d8 * (float)local_3e8);
        uStack_840 = CONCAT44(uStack_3d0._4_4_ * uStack_3e0._4_4_,
                              (float)uStack_3d0 * (float)uStack_3e0);
        local_838 = local_1808;
        uStack_830 = uStack_1800;
        in_stack_ffffffffffffdd64 = uStack_1800._4_4_ + uStack_3d0._4_4_ * uStack_3e0._4_4_;
        uStack_1800 = CONCAT44(in_stack_ffffffffffffdd64,
                               (float)uStack_1800 + (float)uStack_3d0 * (float)uStack_3e0);
        local_17a8 = local_17a8 + 4;
        local_1760 = local_1760 + 4;
        local_17ec = local_17ec + 4;
        in_stack_ffffffffffffdd68 = local_1808;
        local_1808 = (Mat *)CONCAT44(local_1808._4_4_ + local_3d8._4_4_ * local_3e8._4_4_,
                                     (float)local_1808 + (float)local_3d8 * (float)local_3e8);
        local_3e8 = uVar3;
        uStack_3e0 = uVar4;
        local_3d8 = uVar1;
        uStack_3d0 = uVar2;
      }
      local_182c = local_15fc + (float)local_1808 + local_1808._4_4_ + (float)uStack_1800 +
                   uStack_1800._4_4_;
      for (; local_17ec < local_113c; local_17ec = local_17ec + 1) {
        local_182c = *local_17a8 * *local_1760 + local_182c;
        local_17a8 = local_17a8 + 1;
        local_1760 = local_1760 + 1;
      }
      *local_15b8 = local_182c;
      local_15b8 = local_15b8 + 1;
      uStack_d44 = local_d48;
      uStack_d40 = local_d48;
      uStack_d3c = local_d48;
    }
  }
  Mat::~Mat((Mat *)0x13d656);
  Mat::~Mat((Mat *)0x13d663);
  return;
}

Assistant:

static void conv_im2col_sgemm_sse(const Mat &bottom_blob, Mat &top_blob, const Mat & kernel_tm, const Mat& _bias, \
            const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* bias = _bias;

    // im2col
    Mat bottom_im2col(outw*outh, kernel_h*kernel_w*inch, elemsize, opt.workspace_allocator);
    {
        const int stride = kernel_h*kernel_w*outw*outh;
        float* ret = (float*)bottom_im2col;
    
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<inch; p++)
        {
            const float* input = bottom_blob.channel(p);
            int retID = stride * p;
            for (int u=0; u<kernel_h; u++)
            {
                for (int v=0; v<kernel_w; v++)
                {
                    for (int i=0; i<outh; i++)
                    {
                        for (int j=0; j<outw; j++)
                        {
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }
                }
            }
        }
    }

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // bottom_im2col memory packed 4 x 4
    Mat bottom_tm(4*kernel_size, inch, out_size/4 + out_size%4, elemsize, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii=0; ii<nn_size; ii++)
        {
            int i = ii * 4;

            const float* img0 = bottom_im2col.channel(0);
            img0 += i;

            float* tmpptr = bottom_tm.channel(i/4);

            for (int q=0; q<inch*kernel_size; q++)
            {
#if __SSE__
                _mm_storeu_ps(tmpptr, _mm_loadu_ps(img0));
#else                
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img0[2];
                tmpptr[3] = img0[3];
#endif // __SSE__              
                tmpptr += 4;
                img0 += out_size;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_size_start; i<out_size; i++)
        {
            const float* img0 = bottom_im2col.channel(0);
            img0 += i;

            float* tmpptr = bottom_tm.channel(i/4 + i%4);

            for (int q=0; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += out_size;
            }
        }
    }
    
    // sgemm(int M, int N, int L, float* A, float* B, float* C)
    {
        //int M = outch;                    // outch
        int N = outw * outh;                // outsize or out stride
        int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int i =  pp * 4;

            float* output0 = top_blob.channel(i);
            float* output1 = top_blob.channel(i+1);
            float* output2 = top_blob.channel(i+2);
            float* output3 = top_blob.channel(i+3);

            const float zeros[4] = {0.f, 0.f, 0.f, 0.f};
            const float* biasptr = bias ? bias + i : zeros;

            int j=0;
            for (; j+3<N; j=j+4)
            {
                const float* vb = bottom_tm.channel(j/4);
                const float* va = kernel_tm.channel(i/4);
#if __SSE__
                __m128 _sum0 = _mm_set1_ps(biasptr[0]);
                __m128 _sum1 = _mm_set1_ps(biasptr[1]);
                __m128 _sum2 = _mm_set1_ps(biasptr[2]);
                __m128 _sum3 = _mm_set1_ps(biasptr[3]);

                int k=0;
                for (; k+3<L; k=k+4)
                {
                    // k0
                    __m128 _vb = _mm_loadu_ps(vb);
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _va1 = _mm_set1_ps(va[1]);
                    __m128 _va2 = _mm_set1_ps(va[2]);
                    __m128 _va3 = _mm_set1_ps(va[3]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0));// sum0 = (a00-a03) * k00
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1));// sum1 = (a00-a03) * k10
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2));// sum2 = (a00-a03) * k20
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3));// sum3 = (a00-a03) * k30

                    // k1
                    _vb = _mm_loadu_ps(vb+4);
                    _va0 = _mm_set1_ps(va[4]);
                    _va1 = _mm_set1_ps(va[5]);
                    _va2 = _mm_set1_ps(va[6]);
                    _va3 = _mm_set1_ps(va[7]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0));// sum0 = (a10-a13) * k01
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1));// sum1 = (a10-a13) * k11
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2));// sum2 = (a10-a13) * k21
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3));// sum3 = (a10-a13) * k31

                    // k2
                    _vb = _mm_loadu_ps(vb+8);
                    _va0 = _mm_set1_ps(va[8]);
                    _va1 = _mm_set1_ps(va[9]);
                    _va2 = _mm_set1_ps(va[10]);
                    _va3 = _mm_set1_ps(va[11]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0));// sum0 = (a20-a23) * k02
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1));// sum1 = (a20-a23) * k12
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2));// sum2 = (a20-a23) * k22
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3));// sum3 = (a20-a23) * k32

                    // k3
                    _vb = _mm_loadu_ps(vb+12);
                    _va0 = _mm_set1_ps(va[12]);
                    _va1 = _mm_set1_ps(va[13]);
                    _va2 = _mm_set1_ps(va[14]);
                    _va3 = _mm_set1_ps(va[15]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0));// sum0 = (a30-a33) * k03
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1));// sum1 = (a30-a33) * k13
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2));// sum2 = (a30-a33) * k23
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3));// sum3 = (a30-a33) * k33

                    va += 16;
                    vb += 16;
                }

                for (; k<L; k++)
                {
                    // k0
                    __m128 _vb = _mm_loadu_ps(vb);
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _va1 = _mm_set1_ps(va[1]);
                    __m128 _va2 = _mm_set1_ps(va[2]);
                    __m128 _va3 = _mm_set1_ps(va[3]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0));// sum0 = (a00-a03) * k00
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1));// sum1 = (a00-a03) * k10
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2));// sum2 = (a00-a03) * k20
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3));// sum3 = (a00-a03) * k30
                    
                    va += 4;
                    vb += 4;
                }
                _mm_storeu_ps(output0, _sum0);
                _mm_storeu_ps(output1, _sum1);
                _mm_storeu_ps(output2, _sum2);
                _mm_storeu_ps(output3, _sum3);
#else
                float sum0[4] = {0};
                float sum1[4] = {0};
                float sum2[4] = {0};
                float sum3[4] = {0};
               
                int k=0;
                for (; k+7<L; k=k+8)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += va[0] * vb[n];
                        sum1[n] += va[1] * vb[n];
                        sum2[n] += va[2] * vb[n];
                        sum3[n] += va[3] * vb[n];
                        va += 4;

                        sum0[n] += va[0] * vb[n+4];
                        sum1[n] += va[1] * vb[n+4];
                        sum2[n] += va[2] * vb[n+4];
                        sum3[n] += va[3] * vb[n+4];
                        va += 4;

                        sum0[n] += va[0] * vb[n+8];
                        sum1[n] += va[1] * vb[n+8];
                        sum2[n] += va[2] * vb[n+8];
                        sum3[n] += va[3] * vb[n+8];
                        va += 4;

                        sum0[n] += va[0] * vb[n+12];
                        sum1[n] += va[1] * vb[n+12];
                        sum2[n] += va[2] * vb[n+12];
                        sum3[n] += va[3] * vb[n+12];
                        va += 4;

                        sum0[n] += va[0] * vb[n+16];
                        sum1[n] += va[1] * vb[n+16];
                        sum2[n] += va[2] * vb[n+16];
                        sum3[n] += va[3] * vb[n+16];
                        va += 4;

                        sum0[n] += va[0] * vb[n+20];
                        sum1[n] += va[1] * vb[n+20];
                        sum2[n] += va[2] * vb[n+20];
                        sum3[n] += va[3] * vb[n+20];
                        va += 4;

                        sum0[n] += va[0] * vb[n+24];
                        sum1[n] += va[1] * vb[n+24];
                        sum2[n] += va[2] * vb[n+24];
                        sum3[n] += va[3] * vb[n+24];
                        va += 4;

                        sum0[n] += va[0] * vb[n+28];
                        sum1[n] += va[1] * vb[n+28];
                        sum2[n] += va[2] * vb[n+28];
                        sum3[n] += va[3] * vb[n+28];
                        va -= 28;
                    }

                    va += 32;
                    vb += 32;
                }

                for (; k<L; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += va[0] * vb[n];
                        sum1[n] += va[1] * vb[n];
                        sum2[n] += va[2] * vb[n];
                        sum3[n] += va[3] * vb[n];
                    }
                    
                    va += 4;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output0[n] = sum0[n] + biasptr[0];
                    output1[n] = sum1[n] + biasptr[1];
                    output2[n] = sum2[n] + biasptr[2];
                    output3[n] = sum3[n] + biasptr[3];
                }
#endif // __SSE__
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j<N; j++)
            {                
                const float* vb = bottom_tm.channel(j/4 + j%4);
                const float* va = kernel_tm.channel(i/4);
#if __SSE__
                __m128 _sum0_3 = _mm_loadu_ps(biasptr);
                __m128 _sum0 = _mm_set1_ps(0.0);
                __m128 _sum1 = _mm_set1_ps(0.0);
                __m128 _sum2 = _mm_set1_ps(0.0);
                __m128 _sum3 = _mm_set1_ps(0.0);

                int k=0;
                for (; k+3<L; k=k+4)
                {
                    __m128 _vb0 = _mm_set1_ps(vb[0]);
                    __m128 _vb1 = _mm_set1_ps(vb[1]);
                    __m128 _vb2 = _mm_set1_ps(vb[2]);
                    __m128 _vb3 = _mm_set1_ps(vb[3]);
                    __m128 _va0 = _mm_loadu_ps(va);
                    __m128 _va1 = _mm_loadu_ps(va+4);
                    __m128 _va2 = _mm_loadu_ps(va+8);
                    __m128 _va3 = _mm_loadu_ps(va+12);

                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_va0, _vb0));// sum0 += (k00-k30) * a00
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_va1, _vb1));// sum1 += (k01-k31) * a10
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_va2, _vb2));// sum2 += (k02-k32) * a20
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_va3, _vb3));// sum3 += (k03-k33) * a30

                    va += 16;
                    vb += 4;
                }

                _sum0 = _mm_add_ps(_sum0, _sum1);
                _sum2 = _mm_add_ps(_sum2, _sum3);
                _sum0_3 = _mm_add_ps(_sum0_3, _sum0);
                _sum0_3 = _mm_add_ps(_sum0_3, _sum2);

                for (; k<L; k++)
                {
                    __m128 _vb0 = _mm_set1_ps(vb[0]);
                    __m128 _va = _mm_loadu_ps(va); 

                    _sum0_3 = _mm_add_ps(_sum0_3, _mm_mul_ps(_va, _vb0));// sum0 += (k00-k30) * a00

                    va += 4;
                    vb += 1;
                }         
                output0[0] = _sum0_3[0];
                output1[0] = _sum0_3[1];
                output2[0] = _sum0_3[2];
                output3[0] = _sum0_3[3];
#else
                float sum0 = biasptr[0];
                float sum1 = biasptr[1];
                float sum2 = biasptr[2];
                float sum3 = biasptr[3];

                for (int k=0; k<L; k++)
                {
                    sum0 += va[0] * vb[0];
                    sum1 += va[1] * vb[0];
                    sum2 += va[2] * vb[0];
                    sum3 += va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }
                
                output0[0] = sum0;
                output1[0] = sum1;
                output2[0] = sum2;
                output3[0] = sum3;
#endif // __SSE__
                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_outch_start; i<outch; i++)
        {
            float* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;

            int j=0;
            for (; j+3<N; j=j+4)
            {
                const float* vb = bottom_tm.channel(j/4);       
                const float* va = kernel_tm.channel(i/4 + i%4);
#if __SSE__
                __m128 _sum0 = _mm_set1_ps(bias0);

                int k=0;
                for (; k+3<L; k=k+4)
                {
                    // k0
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _va1 = _mm_set1_ps(va[1]);
                    __m128 _va2 = _mm_set1_ps(va[2]);
                    __m128 _va3 = _mm_set1_ps(va[3]);
                    __m128 _vb0 = _mm_loadu_ps(vb);
                    __m128 _vb1 = _mm_loadu_ps(vb+4);
                    __m128 _vb2 = _mm_loadu_ps(vb+8);
                    __m128 _vb3 = _mm_loadu_ps(vb+12);

                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb0, _va0));// sum0 = (a00-a03) * k00                
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb1, _va1));// sum0 += (a10-a13) * k01
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb2, _va2));// sum0 += (a20-a23) * k02
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb3, _va3));// sum0 += (a30-a33) * k03
                
                    va += 4;
                    vb += 16;
                }

                for (; k<L; k++)
                {
                    // k0
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _vb0 = _mm_loadu_ps(vb);

                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb0, _va0));    // sum0 = (a00-a03) * k00

                    va += 1;
                    vb += 4;
                }
                _mm_storeu_ps(output, _sum0); 
#else                
                float sum[4] = {0};

                int k=0;
                for (; k+3<L; k=k+4)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += va[0] * vb[n];
                        sum[n] += va[1] * vb[n+4];
                        sum[n] += va[2] * vb[n+8];
                        sum[n] += va[3] * vb[n+12];
                        //sum[n] += va[4] * vb[n+16];
                        //sum[n] += va[5] * vb[n+20];
                        //sum[n] += va[6] * vb[n+24];
                        //sum[n] += va[7] * vb[n+28];
                    }

                    va += 4;
                    vb += 16;
                }

                for (; k<L; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += va[0] * vb[n];
                    }

                    va += 1;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output[n] = sum[n] + bias0;
                }
#endif // __SSE__
                output += 4;
            }

            for (; j<N; j++)
            {
                const float* vb = bottom_tm.channel(j/4 + j%4);
                const float* va = kernel_tm.channel(i/4 + i%4);

                int k=0;
#if __SSE__
                __m128 _sum0 = _mm_set1_ps(0.f);

                for (; k+3<L; k+=4)
                {
                    __m128 _p0 = _mm_loadu_ps(vb);
                    __m128 _k0 = _mm_loadu_ps(va);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_p0, _k0));

                    va += 4;
                    vb += 4;                    
                }
                float sum0 = bias0 + _sum0[0] + _sum0[1] + _sum0[2] + _sum0[3];
#else
                float sum0 = bias0;
#endif // __SSE__
                for (; k<L; k++)
                {
                    sum0 += va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = sum0;

                output++;
            }
        }
    }   
}